

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O0

dlist_t * dlist_getl(dlist_head_t *head,dlist_t *dlist)

{
  dlist_s *pdVar1;
  bool bVar2;
  dlist_s *pdStack_28;
  int found;
  dlist_t *tmp;
  dlist_t *dlist_local;
  dlist_head_t *head_local;
  
  pdStack_28 = head->dlist;
  bVar2 = false;
  if (((head == (dlist_head_t *)0x0) || (dlist == (dlist_t *)0x0)) || (pdStack_28 == (dlist_s *)0x0)
     ) {
    head_local = (dlist_head_t *)0x0;
  }
  else {
    if (head->dlist == dlist) {
      head->dlist = dlist->next;
      if (head->dlist != (dlist_s *)0x0) {
        head->dlist->prev = (dlist_s *)0x0;
      }
      bVar2 = true;
    }
    if (head->end == dlist) {
      head->end = dlist->prev;
      if (head->end != (dlist_s *)0x0) {
        head->end->next = (dlist_s *)0x0;
      }
      bVar2 = true;
    }
    if (!bVar2) {
      while( true ) {
        bVar2 = false;
        if (pdStack_28->next != (dlist_s *)0x0) {
          bVar2 = pdStack_28->next != dlist;
        }
        if (!bVar2) break;
        pdStack_28 = pdStack_28->next;
      }
      if (pdStack_28->next == (dlist_s *)0x0) {
        return (dlist_t *)0x0;
      }
      pdVar1 = dlist->next;
      pdStack_28->next = pdVar1;
      if (pdVar1 != (dlist_s *)0x0) {
        pdStack_28->next->prev = pdStack_28;
      }
    }
    head->num = head->num - 1;
    dlist->next = (dlist_s *)0x0;
    dlist->prev = (dlist_s *)0x0;
    head_local = (dlist_head_t *)dlist;
  }
  return (dlist_t *)head_local;
}

Assistant:

dlist_t *dlist_getl(dlist_head_t *head, dlist_t *dlist) {
   dlist_t *tmp = head->dlist;
   int     found = 0;

   if (!head || !dlist || !tmp)
      return NULL;

   if (head->dlist == dlist) {
      head->dlist = dlist->next;
      if (head->dlist)
         head->dlist->prev = NULL;

      found = 1;
   }

   if (head->end == dlist) {
      head->end = dlist->prev;
      if (head->end)
         head->end->next = NULL;

      found = 1;
   }

   if (!found) {
      while (tmp->next && (tmp->next != dlist)) {
         tmp = tmp->next;
      }
      
      if (!tmp->next) {
         return NULL;
      } else {
         if ((tmp->next = dlist->next)) {
            tmp->next->prev = tmp;
         }
      }
   }

   head->num--;
   dlist->prev = dlist->next = NULL;
   return dlist;
}